

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

If_Obj_t * If_ManCreateCo(If_Man_t *p,If_Obj_t *pDriver)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  If_Obj_t *pIVar5;
  void **ppvVar6;
  int iVar7;
  If_Obj_t *pIVar8;
  
  pIVar5 = If_ManSetupObj(p);
  pVVar2 = p->vCos;
  uVar1 = pVVar2->nSize;
  pIVar5->IdPio = uVar1;
  uVar4 = pVVar2->nCap;
  if (uVar1 == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar6;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar4 * 2;
      if (iVar7 <= (int)uVar4) goto LAB_0042ce31;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar4 << 4);
      }
      pVVar2->pArray = ppvVar6;
    }
    pVVar2->nCap = iVar7;
  }
LAB_0042ce31:
  iVar7 = pVVar2->nSize;
  pVVar2->nSize = iVar7 + 1;
  pVVar2->pArray[iVar7] = pIVar5;
  *(uint *)pIVar5 = (*(uint *)pIVar5 & 0xffffffe0) + ((uint)pDriver & 1) * 0x10 + 3;
  pIVar8 = (If_Obj_t *)((ulong)pDriver & 0xfffffffffffffffe);
  pIVar5->pFanin0 = pIVar8;
  pIVar8->nRefs = pIVar8->nRefs + 1;
  uVar1 = *(uint *)pIVar5;
  uVar3 = (uVar1 * 4 ^ *(uint *)pIVar8) & 0x40;
  *(uint *)pIVar5 = uVar1 & 0xffffffbf | uVar3;
  uVar4 = *(uint *)pIVar8;
  *(uint *)pIVar5 = uVar1 & 0x1fbf | uVar3 | uVar4 & 0xffffe000;
  uVar4 = uVar4 >> 0xd;
  if (p->nLevelMax < (int)uVar4) {
    p->nLevelMax = uVar4;
  }
  p->nObjs[3] = p->nObjs[3] + 1;
  return pIVar5;
}

Assistant:

If_Obj_t * If_ManCreateCo( If_Man_t * p, If_Obj_t * pDriver )
{
    If_Obj_t * pObj;
    pObj = If_ManSetupObj( p );
    pObj->IdPio = Vec_PtrSize( p->vCos );
    Vec_PtrPush( p->vCos, pObj );
    pObj->Type = IF_CO;
    pObj->fCompl0 = If_IsComplement(pDriver); pDriver = If_Regular(pDriver);
    pObj->pFanin0 = pDriver; pDriver->nRefs++; 
    pObj->fPhase  = (pObj->fCompl0 ^ pDriver->fPhase);
    pObj->Level   = pDriver->Level;
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_CO]++;
    return pObj;
}